

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lratchecker.cpp
# Opt level: O1

void __thiscall CaDiCaL::LratChecker::enlarge_vars(LratChecker *this,int64_t idx)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 2;
  if (this->size_vars != 0) {
    lVar1 = this->size_vars * 2;
  }
  do {
    lVar2 = lVar1;
    lVar1 = lVar2 * 2;
  } while (lVar2 <= idx);
  std::vector<signed_char,_std::allocator<signed_char>_>::resize(&this->marks,lVar2 * 2);
  std::vector<signed_char,_std::allocator<signed_char>_>::resize(&this->checked_lits,lVar2 * 2);
  this->size_vars = lVar2;
  return;
}

Assistant:

void LratChecker::enlarge_vars (int64_t idx) {

  assert (0 < idx), assert (idx <= INT_MAX);

  int64_t new_size_vars = size_vars ? 2 * size_vars : 2;
  while (idx >= new_size_vars)
    new_size_vars *= 2;
  LOG ("LRAT CHECKER enlarging variables of checker from %" PRId64
       " to %" PRId64 "",
       size_vars, new_size_vars);

  marks.resize (2 * new_size_vars);
  checked_lits.resize (2 * new_size_vars);

  assert (idx < new_size_vars);
  size_vars = new_size_vars;
}